

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O3

N_Vector N_VNewEmpty_MultiFab(sunindextype length)

{
  N_Vector __ptr;
  N_Vector_Ops __ptr_00;
  sunindextype *psVar1;
  
  __ptr = (N_Vector)malloc(0x18);
  if (__ptr != (N_Vector)0x0) {
    __ptr_00 = (N_Vector_Ops)malloc(0x1b8);
    if (__ptr_00 != (N_Vector_Ops)0x0) {
      __ptr_00->nvgetvectorid = (_func_N_Vector_ID_N_Vector *)0x0;
      __ptr_00->nvclone = N_VClone_MultiFab;
      __ptr_00->nvcloneempty = N_VCloneEmpty_MultiFab;
      __ptr_00->nvdestroy = N_VDestroy_MultiFab;
      __ptr_00->nvspace = N_VSpace_MultiFab;
      __ptr_00->nvgetarraypointer = (_func_realtype_ptr_N_Vector *)0x0;
      __ptr_00->nvsetarraypointer = (_func_void_realtype_ptr_N_Vector *)0x0;
      __ptr_00->nvgetlength = N_VGetLength_MultiFab;
      __ptr_00->nvlinearsum = N_VLinearSum_MultiFab;
      __ptr_00->nvconst = N_VConst_MultiFab;
      __ptr_00->nvprod = N_VProd_MultiFab;
      __ptr_00->nvdiv = N_VDiv_MultiFab;
      __ptr_00->nvscale = N_VScale_MultiFab;
      __ptr_00->nvabs = N_VAbs_MultiFab;
      __ptr_00->nvinv = N_VInv_MultiFab;
      __ptr_00->nvaddconst = N_VAddConst_MultiFab;
      __ptr_00->nvdotprod = N_VDotProd_MultiFab;
      __ptr_00->nvmaxnorm = N_VMaxNorm_MultiFab;
      __ptr_00->nvwrmsnormmask = N_VWrmsNormMask_MultiFab;
      __ptr_00->nvwrmsnorm = N_VWrmsNorm_MultiFab;
      __ptr_00->nvmin = N_VMin_MultiFab;
      __ptr_00->nvwl2norm = N_VWL2Norm_MultiFab;
      __ptr_00->nvl1norm = N_VL1Norm_MultiFab;
      __ptr_00->nvcompare = N_VCompare_MultiFab;
      __ptr_00->nvinvtest = N_VInvTest_MultiFab;
      __ptr_00->nvconstrmask = N_VConstrMask_MultiFab;
      __ptr_00->nvminquotient = N_VMinQuotient_MultiFab;
      psVar1 = (sunindextype *)malloc(0x10);
      __ptr_00->nvlinearcombination = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0;
      __ptr_00->nvscaleaddmulti =
           (_func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr_00->nvdotprodmulti = (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0;
      __ptr_00->nvlinearsumvectorarray =
           (_func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr_00->nvscalevectorarray = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr_00->nvconstvectorarray = (_func_int_int_realtype_N_Vector_ptr *)0x0;
      __ptr_00->nvwrmsnormvectorarray = (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0;
      __ptr_00->nvwrmsnormmaskvectorarray =
           (_func_int_int_N_Vector_ptr_N_Vector_ptr_N_Vector_realtype_ptr *)0x0;
      __ptr_00->nvscaleaddmultivectorarray =
           (_func_int_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)0x0;
      __ptr_00->nvlinearcombinationvectorarray =
           (_func_int_int_int_realtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
      if (psVar1 != (sunindextype *)0x0) {
        *psVar1 = length;
        psVar1[1] = 0;
        psVar1[2] = 0;
        psVar1[3] = 0;
        __ptr->content = psVar1;
        __ptr->ops = __ptr_00;
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VNewEmpty_MultiFab(sunindextype length)
{
    N_Vector v;
    N_Vector_Ops ops;
    N_VectorContent_MultiFab content;

    /* Create vector */
    v = NULL;
    v = (N_Vector) malloc(sizeof *v);
    if (v == NULL) return(NULL);

    /* Create vector operation structure */
    ops = NULL;
    ops = (N_Vector_Ops) malloc(sizeof *ops);
    if (ops == NULL) { free(v); return(NULL); }

    ops->nvgetvectorid     = NULL;
    ops->nvclone           = N_VClone_MultiFab;
    ops->nvcloneempty      = N_VCloneEmpty_MultiFab;
    ops->nvdestroy         = N_VDestroy_MultiFab;
    ops->nvspace           = N_VSpace_MultiFab;
    ops->nvgetarraypointer = NULL;
    ops->nvsetarraypointer = NULL;
    ops->nvgetlength       = N_VGetLength_MultiFab;

    /* standard vector operations */
    ops->nvlinearsum    = N_VLinearSum_MultiFab;
    ops->nvconst        = N_VConst_MultiFab;
    ops->nvprod         = N_VProd_MultiFab;
    ops->nvdiv          = N_VDiv_MultiFab;
    ops->nvscale        = N_VScale_MultiFab;
    ops->nvabs          = N_VAbs_MultiFab;
    ops->nvinv          = N_VInv_MultiFab;
    ops->nvaddconst     = N_VAddConst_MultiFab;
    ops->nvdotprod      = N_VDotProd_MultiFab;
    ops->nvmaxnorm      = N_VMaxNorm_MultiFab;
    ops->nvwrmsnormmask = N_VWrmsNormMask_MultiFab;
    ops->nvwrmsnorm     = N_VWrmsNorm_MultiFab;
    ops->nvmin          = N_VMin_MultiFab;
    ops->nvwl2norm      = N_VWL2Norm_MultiFab;
    ops->nvl1norm       = N_VL1Norm_MultiFab;
    ops->nvcompare      = N_VCompare_MultiFab;
    ops->nvinvtest      = N_VInvTest_MultiFab;
    ops->nvconstrmask   = N_VConstrMask_MultiFab;
    ops->nvminquotient  = N_VMinQuotient_MultiFab;

    /* fused vector operations (optional, NULL means disabled by default) */
    ops->nvlinearcombination = NULL;
    ops->nvscaleaddmulti     = NULL;
    ops->nvdotprodmulti      = NULL;

    /* vector array operations (optional, NULL means disabled by default) */
    ops->nvlinearsumvectorarray         = NULL;
    ops->nvscalevectorarray             = NULL;
    ops->nvconstvectorarray             = NULL;
    ops->nvwrmsnormvectorarray          = NULL;
    ops->nvwrmsnormmaskvectorarray      = NULL;
    ops->nvscaleaddmultivectorarray     = NULL;
    ops->nvlinearcombinationvectorarray = NULL;

    /* Create content */
    content = NULL;
    content = (N_VectorContent_MultiFab) malloc(sizeof *content);
    if (content == NULL) { free(ops); free(v); return(NULL); }

    content->length = length;
    content->own_mf = SUNFALSE;
    content->mf     = NULL;

    /* Attach content and ops */
    v->content = content;
    v->ops     = ops;

    return(v);
}